

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O1

void __thiscall SymbolData::addLabel(SymbolData *this,int64_t memoryAddress,string *name)

{
  int iVar1;
  pointer pSVar2;
  size_t __n;
  _Alloc_hider __s2;
  size_type sVar3;
  int64_t iVar4;
  int iVar5;
  SymDataSymbol *symbol;
  pointer pSVar6;
  SymDataSymbol sym;
  value_type local_60;
  pointer local_38;
  
  if (this->enabled == true) {
    local_60.name._M_dataplus._M_p = (pointer)&local_60.name.field_2;
    local_60.name._M_string_length = 0;
    local_60.name.field_2._M_local_buf[0] = '\0';
    local_60.address = memoryAddress;
    std::__cxx11::string::_M_assign((string *)&local_60);
    iVar4 = local_60.address;
    sVar3 = local_60.name._M_string_length;
    __s2._M_p = local_60.name._M_dataplus._M_p;
    iVar1 = this->currentModule;
    local_38 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = *(pointer *)
              ((long)&local_38[iVar1].symbols.
                      super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl + 8)
    ;
    for (pSVar6 = *(pointer *)
                   &local_38[iVar1].symbols.
                    super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl;
        pSVar6 != pSVar2; pSVar6 = pSVar6 + 1) {
      if (((pSVar6->address == iVar4) && (__n = (pSVar6->name)._M_string_length, __n == sVar3)) &&
         ((__n == 0 || (iVar5 = bcmp((pSVar6->name)._M_dataplus._M_p,__s2._M_p,__n), iVar5 == 0))))
      goto LAB_00140749;
    }
    std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::push_back
              (&local_38[iVar1].symbols,&local_60);
LAB_00140749:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != &local_60.name.field_2) {
      operator_delete(local_60.name._M_dataplus._M_p,
                      CONCAT71(local_60.name.field_2._M_allocated_capacity._1_7_,
                               local_60.name.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void SymbolData::addLabel(int64_t memoryAddress, const std::string& name)
{
	if (!enabled)
		return;
	
	SymDataSymbol sym;
	sym.address = memoryAddress;
	sym.name = name;

	for (SymDataSymbol& symbol: modules[currentModule].symbols)
	{
		if (symbol.address == sym.address && symbol.name == sym.name)
			return;
	}

	modules[currentModule].symbols.push_back(sym);
}